

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O1

void __thiscall argsman_tests::util_ArgsMerge::test_method(util_ArgsMerge *this)

{
  _Base_ptr *pp_Var1;
  char cVar2;
  string arg;
  pointer pbVar3;
  Action AVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  undefined1 **ppuVar8;
  FILE *__s;
  system_error *this_00;
  int *piVar9;
  error_category *peVar10;
  _Base_ptr p_Var11;
  size_t sVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  Action AVar16;
  long lVar17;
  char *pcVar18;
  pointer this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  int iVar20;
  char *pcVar21;
  string *psVar22;
  iterator pvVar23;
  uchar *puVar24;
  string *psVar25;
  iterator pvVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  long lVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *conf_val;
  undefined8 *puVar28;
  long in_FS_OFFSET;
  initializer_list<const_char_*> __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  Span<unsigned_char> output;
  Span<const_unsigned_char> s;
  const_string file_09;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  check_type cVar32;
  undefined1 in_stack_fffffffffffff6f8 [14];
  char cVar29;
  char cVar30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar31;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  _Rb_tree_node_base local_870;
  char *local_850;
  char *local_848;
  _Rb_tree_node_base local_840;
  char *local_820;
  char *local_818;
  _Rb_tree_node_base local_810;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char *local_720;
  char *local_718;
  _Rb_tree_node_base local_710;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock21;
  CHash256 out_sha;
  Action local_678 [4];
  Action local_668 [4];
  string out_sha_hex;
  string local_638;
  string local_618;
  string local_5f8;
  uchar out_sha_bytes [32];
  string local_5b8;
  string local_598;
  string local_578;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignored;
  undefined1 local_520 [32];
  string local_500;
  istringstream conf_stream;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0 [6];
  ios_base local_468 [264];
  string conf;
  string error;
  long *local_320 [2];
  long local_310 [2];
  string key;
  undefined1 local_2e0 [32];
  string desc;
  TestArgsManager parser;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256(&out_sha.sha);
  ppuVar8 = (undefined1 **)getenv("ARGS_MERGE_TEST_OUT");
  if (ppuVar8 == (undefined1 **)0x0) {
    __s = (FILE *)0x0;
  }
  else {
    _conf_stream = ppuVar8;
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              ((path *)&parser,(char **)&conf_stream,auto_format);
    __s = fsbridge::fopen((char *)&parser,"w");
    std::filesystem::__cxx11::path::~path((path *)&parser);
    if (__s == (FILE *)0x0) {
      this_00 = (system_error *)__cxa_allocate_exception(0x20);
      piVar9 = __errno_location();
      iVar7 = *piVar9;
      peVar10 = (error_category *)std::_V2::generic_category();
      std::system_error::system_error(this_00,iVar7,peVar10,"fopen failed");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
LAB_00288f79:
        __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
      }
LAB_00289568:
      __stack_chk_fail();
    }
  }
  local_678[2] = NONE;
  local_678[0] = NONE;
  local_678[1] = NONE;
  do {
    lVar17 = 0;
    bVar6 = false;
    iVar7 = -1;
    do {
      do {
        iVar20 = *(int *)((long)local_678 + lVar17);
        if (iVar20 == iVar7) {
          bVar6 = true;
        }
        lVar17 = lVar17 + 4;
        iVar7 = iVar20;
      } while (lVar17 != 0xc && (0xfffffffd < iVar20 - 3U && !bVar6));
      if (!bVar6) {
        local_668[2] = NONE;
        local_668[0] = NONE;
        local_668[1] = NONE;
        do {
          lVar17 = 0;
          bVar6 = false;
          iVar7 = -1;
          do {
            do {
              iVar20 = *(int *)((long)local_668 + lVar17);
              if (iVar20 == iVar7) {
                bVar6 = true;
              }
              lVar17 = lVar17 + 4;
              iVar7 = iVar20;
            } while (lVar17 != 0xc && (0xfffffffb < iVar20 - 5U && !bVar6));
            if (!bVar6) {
              local_710._M_right._6_2_ = 0x100;
              lVar17 = 0;
              do {
                cVar29 = *(char *)((long)&local_710._M_right + lVar17 + 6U);
                local_710._M_right._4_2_ = 0x100;
                lVar15 = 0;
                do {
                  cVar30 = *(char *)((long)&local_710._M_right + lVar15 + 4U);
                  ChainTypeToString_abi_cxx11_((string *)out_sha_bytes,MAIN);
                  ChainTypeToString_abi_cxx11_(&local_5b8,TESTNET);
                  ChainTypeToString_abi_cxx11_(&local_598,TESTNET4);
                  ChainTypeToString_abi_cxx11_(&local_578,SIGNET);
                  lVar27 = 0;
                  do {
                    ChainTypeToString_abi_cxx11_(&out_sha_hex,MAIN);
                    ChainTypeToString_abi_cxx11_(&local_638,TESTNET);
                    ChainTypeToString_abi_cxx11_(&local_618,TESTNET4);
                    ChainTypeToString_abi_cxx11_(&local_5f8,SIGNET);
                    lVar14 = 0;
                    do {
                      __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&out_sha_hex._M_dataplus._M_p + lVar14);
                      local_710._M_right._2_2_ = 0x100;
                      lVar13 = 0;
                      pbVar31 = __str;
                      do {
                        cVar2 = *(char *)((long)&local_710._M_right + lVar13 + 2U);
                        ArgsManager::ArgsManager(&parser.super_ArgsManager);
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::clear(&parser.super_ArgsManager.m_network_only_args._M_t);
                        criticalblock21.super_unique_lock._M_owns = false;
                        criticalblock21.super_unique_lock._M_device =
                             (mutex_type *)&parser.super_ArgsManager;
                        std::unique_lock<std::recursive_mutex>::lock
                                  (&criticalblock21.super_unique_lock);
                        desc._M_dataplus._M_p = (pointer)&desc.field_2;
                        desc.field_2._M_allocated_capacity._0_4_ = 0x3d74656e;
                        desc._M_string_length = 4;
                        desc.field_2._M_allocated_capacity._4_4_ =
                             desc.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  (&desc,(__str->_M_dataplus)._M_p,__str->_M_string_length);
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                                  (&parser.super_ArgsManager.m_network,__str);
                        pcVar21 = "server";
                        if (cVar2 != '\0') {
                          pcVar21 = "wallet";
                        }
                        local_2e0._0_8_ = local_2e0 + 0x10;
                        pcVar18 = "";
                        if (cVar2 != '\0') {
                          pcVar18 = "";
                        }
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_2e0,pcVar21,pcVar18);
                        std::operator+(&key,"-",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_2e0);
                        _conf_stream = (undefined **)((ulong)_conf_stream & 0xffffffff00000000);
                        ArgsManager::AddArg(&parser.super_ArgsManager,&key,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_2e0,1,(OptionsCategory *)&conf_stream);
                        if (cVar2 != '\0') {
                          local_320[0] = local_310;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)local_320,key._M_dataplus._M_p,
                                     key._M_dataplus._M_p + key._M_string_length);
                          arg._M_string_length._6_1_ = cVar29;
                          arg._0_14_ = in_stack_fffffffffffff6f8;
                          arg._M_string_length._7_1_ = cVar30;
                          arg.field_2._M_allocated_capacity = (size_type)__s;
                          arg.field_2._8_8_ = pbVar31;
                          TestArgsManager::SetNetworkOnlyArg(&parser,arg);
                          if (local_320[0] != local_310) {
                            operator_delete(local_320[0],local_310[0] + 1);
                          }
                        }
                        local_4d0[0]._0_2_ = 0x61;
                        psVar22 = (string *)local_2e0;
                        psVar25 = (string *)&conf_stream;
                        _conf_stream = (undefined **)local_4d0;
                        ArgsMergeTestingSetup::GetValues
                                  (&args,&this->super_ArgsMergeTestingSetup,(ActionList *)local_678,
                                   (string *)(out_sha_bytes + lVar27),psVar22,(string *)&conf_stream
                                  );
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)_conf_stream != local_4d0) {
                          operator_delete(_conf_stream,local_4d0[0]._M_allocated_capacity + 1);
                        }
                        _conf_stream = (undefined **)0xe587db;
                        __l._M_len = 1;
                        __l._M_array = (iterator)&conf_stream;
                        std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                                  (&argv,__l,(allocator_type *)&ignored);
                        pbVar3 = args.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                        for (this_01 = args.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start; this_01 != pbVar3;
                            this_01 = this_01 + 1) {
                          psVar22 = (string *)0x1;
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                    (this_01,0,0,"-",1);
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&desc," ");
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_append(&desc,(this_01->_M_dataplus)._M_p,this_01->_M_string_length);
                          _conf_stream = (undefined **)(this_01->_M_dataplus)._M_p;
                          std::vector<char_const*,std::allocator<char_const*>>::
                          emplace_back<char_const*>
                                    ((vector<char_const*,std::allocator<char_const*>> *)&argv,
                                     (char **)&conf_stream);
                        }
                        error._M_dataplus._M_p = (pointer)&error.field_2;
                        error._M_string_length = 0;
                        error.field_2._M_local_buf[0] = '\0';
                        local_760 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                        ;
                        local_758 = "";
                        local_770 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_768 = &boost::unit_test::basic_cstring<char_const>::null;
                        file.m_end = (iterator)0x34b;
                        file.m_begin = (iterator)&local_760;
                        msg.m_end = (iterator)psVar25;
                        msg.m_begin = (iterator)psVar22;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file,
                                   (size_t)&local_770,msg);
                        _cVar32 = 0x287641;
                        bVar6 = ArgsManager::ParseParameters
                                          (&parser.super_ArgsManager,
                                           (int)((ulong)((long)argv.
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)argv.
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
                                           argv.
                                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start,&error);
                        ignored._M_t._M_impl._0_1_ = bVar6;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                             (_Base_ptr)0x0;
                        local_58._0_8_ = "parser.ParseParameters(argv.size(), argv.data(), error)";
                        local_58._8_8_ = "";
                        _conf_stream = &PTR__lazy_ostream_013abc70;
                        local_4d0[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
                        local_4d0[0]._8_8_ = local_58;
                        local_780 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                        ;
                        local_778 = "";
                        pvVar23 = (iterator)0x1;
                        pvVar26 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)&ignored,(lazy_ostream *)&conf_stream,1,0,
                                   WARN,_cVar32,(size_t)&local_780,0x34b);
                        boost::detail::shared_count::~shared_count
                                  ((shared_count *)
                                   &ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
                        local_790 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                        ;
                        local_788 = "";
                        local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_798 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_00.m_end = (iterator)0x34c;
                        file_00.m_begin = (iterator)&local_790;
                        msg_00.m_end = pvVar26;
                        msg_00.m_begin = pvVar23;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                                   (size_t)&local_7a0,msg_00);
                        local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                        local_58._0_8_ = &PTR__lazy_ostream_013abb30;
                        aStack_48._M_allocated_capacity =
                             (size_type)boost::unit_test::lazy_ostream::inst;
                        aStack_48._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                        iVar7 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                compare(&error,"");
                        conf._M_dataplus._M_p._0_1_ = iVar7 == 0;
                        conf._M_string_length = 0;
                        conf.field_2._M_allocated_capacity = 0;
                        local_810._0_8_ =
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                        ;
                        local_810._M_parent = (_Base_ptr)0xe561df;
                        _conf_stream = &PTR__lazy_ostream_013abbf0;
                        local_4d0[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
                        local_4d0[0]._8_8_ = &local_500;
                        local_520._0_8_ = "";
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                             ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                             0xffffffffffffff00;
                        ignored._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ac170;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                             (_Base_ptr)local_520;
                        local_500._M_dataplus._M_p = (pointer)&error;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)&conf,(lazy_ostream *)local_58,1,2,REQUIRE,
                                   0x112731f,(size_t)&local_810,0x34c,(string *)&conf_stream,"\"\"",
                                   &ignored);
                        boost::detail::shared_count::~shared_count
                                  ((shared_count *)&conf.field_2._M_allocated_capacity);
                        conf._M_string_length = 0;
                        conf.field_2._M_allocated_capacity =
                             conf.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        local_4d0[0]._0_2_ = 99;
                        psVar22 = (string *)local_2e0;
                        psVar25 = (string *)&conf_stream;
                        _conf_stream = (undefined **)local_4d0;
                        conf._M_dataplus._M_p = (pointer)&conf.field_2;
                        ArgsMergeTestingSetup::GetValues
                                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&ignored,&this->super_ArgsMergeTestingSetup,
                                   (ActionList *)local_668,(string *)(out_sha_bytes + lVar27),
                                   psVar22,(string *)&conf_stream);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)_conf_stream != local_4d0) {
                          operator_delete(_conf_stream,
                                          (ulong)(local_4d0[0]._M_allocated_capacity + 1));
                        }
                        uVar5 = ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                        __str = pbVar31;
                        for (puVar28 = (undefined8 *)ignored._M_t._M_impl._0_8_;
                            puVar28 != (undefined8 *)uVar5; puVar28 = puVar28 + 4) {
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&desc," ");
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_append(&desc,(char *)*puVar28,puVar28[1]);
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_append(&conf,(char *)*puVar28,puVar28[1]);
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&conf,"\n");
                        }
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&ignored);
                        std::__cxx11::istringstream::istringstream
                                  ((istringstream *)&conf_stream,(string *)&conf,_S_in);
                        local_7b0 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                        ;
                        local_7a8 = "";
                        local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_01.m_end = (iterator)0x356;
                        file_01.m_begin = (iterator)&local_7b0;
                        msg_01.m_end = (iterator)psVar25;
                        msg_01.m_begin = (iterator)psVar22;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                                   (size_t)&local_7c0,msg_01);
                        pp_Var1 = &ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                             (_Base_ptr)0x68746170656c6966;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 8;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                             (_Base_ptr)
                             ((ulong)ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
                             0xffffffffffffff00);
                        _cVar32 = 0x287a55;
                        ignored._M_t._M_impl._0_8_ = pp_Var1;
                        bVar6 = ArgsManager::ReadConfigStream
                                          (&parser.super_ArgsManager,(istream *)&conf_stream,
                                           (string *)&ignored,&error,false);
                        local_810._M_color._0_1_ = bVar6;
                        local_810._M_parent = (_Base_ptr)0x0;
                        local_810._M_left = (_Base_ptr)0x0;
                        local_500._M_dataplus._M_p =
                             "parser.ReadConfigStream(conf_stream, \"filepath\", error)";
                        local_500._M_string_length = 0xe58746;
                        local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                        local_58._0_8_ = &PTR__lazy_ostream_013abc70;
                        aStack_48._M_allocated_capacity =
                             (size_type)boost::unit_test::lazy_ostream::inst;
                        aStack_48._8_8_ = &local_500;
                        local_7d0 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                        ;
                        local_7c8 = "";
                        pvVar23 = (iterator)0x1;
                        pvVar26 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)&local_810,(lazy_ostream *)local_58,1,0,WARN,
                                   _cVar32,(size_t)&local_7d0,0x356);
                        boost::detail::shared_count::~shared_count
                                  ((shared_count *)&local_810._M_left);
                        if ((_Base_ptr *)ignored._M_t._M_impl._0_8_ != pp_Var1) {
                          operator_delete((void *)ignored._M_t._M_impl._0_8_,
                                          (ulong)((long)&(ignored._M_t._M_impl.super__Rb_tree_header
                                                          ._M_header._M_parent)->_M_color + 1));
                        }
                        local_7e0 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                        ;
                        local_7d8 = "";
                        local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_02.m_end = (iterator)0x357;
                        file_02.m_begin = (iterator)&local_7e0;
                        msg_02.m_end = pvVar26;
                        msg_02.m_begin = pvVar23;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                                   (size_t)&local_7f0,msg_02);
                        local_810._M_parent =
                             (_Base_ptr)((ulong)local_810._M_parent & 0xffffffffffffff00);
                        local_810._0_8_ = &PTR__lazy_ostream_013abb30;
                        local_810._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                        local_810._M_right = (_Base_ptr)0xf6cf21;
                        iVar7 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                compare(&error,"");
                        local_500._M_dataplus._M_p._0_1_ = iVar7 == 0;
                        local_500._M_string_length = 0;
                        local_500.field_2._M_allocated_capacity = 0;
                        local_520._0_8_ =
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                        ;
                        local_520._8_8_ = "";
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                             ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                             0xffffffffffffff00;
                        ignored._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abbf0;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &local_710;
                        local_720 = "";
                        local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                        local_58._0_8_ = &PTR__lazy_ostream_013ac170;
                        aStack_48._M_allocated_capacity =
                             (size_type)boost::unit_test::lazy_ostream::inst;
                        aStack_48._8_8_ = &local_720;
                        pvVar23 = (iterator)0x1;
                        pvVar26 = (iterator)0x2;
                        local_710._0_8_ = &error;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)&local_500,(lazy_ostream *)&local_810,1,2,
                                   REQUIRE,0x112731f,(size_t)local_520,0x357,&ignored,"\"\"",
                                   local_58);
                        boost::detail::shared_count::~shared_count
                                  ((shared_count *)&local_500.field_2._M_allocated_capacity);
                        if (cVar29 != '\0') {
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&desc," soft");
                          pp_Var1 = &ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 5;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)
                               CONCAT26(ignored._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent._6_2_,0x3174666f73);
                          ignored._M_t._M_impl._0_8_ = pp_Var1;
                          ArgsManager::SoftSetArg(&parser.super_ArgsManager,&key,(string *)&ignored)
                          ;
                          if ((_Base_ptr *)ignored._M_t._M_impl._0_8_ != pp_Var1) {
                            operator_delete((void *)ignored._M_t._M_impl._0_8_,
                                            (ulong)((long)&(ignored._M_t._M_impl.
                                                            super__Rb_tree_header._M_header.
                                                           _M_parent)->_M_color + 1));
                          }
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 5;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)
                               CONCAT26(ignored._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent._6_2_,0x3274666f73);
                          ignored._M_t._M_impl._0_8_ = pp_Var1;
                          ArgsManager::SoftSetArg(&parser.super_ArgsManager,&key,(string *)&ignored)
                          ;
                          if ((_Base_ptr *)ignored._M_t._M_impl._0_8_ != pp_Var1) {
                            operator_delete((void *)ignored._M_t._M_impl._0_8_,
                                            (ulong)((long)&(ignored._M_t._M_impl.
                                                            super__Rb_tree_header._M_header.
                                                           _M_parent)->_M_color + 1));
                          }
                        }
                        if (cVar30 != '\0') {
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&desc," force");
                          pp_Var1 = &ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 6;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)
                               CONCAT17(ignored._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent._7_1_,0x316563726f66);
                          ignored._M_t._M_impl._0_8_ = pp_Var1;
                          ArgsManager::ForceSetArg
                                    (&parser.super_ArgsManager,&key,(string *)&ignored);
                          if ((_Base_ptr *)ignored._M_t._M_impl._0_8_ != pp_Var1) {
                            operator_delete((void *)ignored._M_t._M_impl._0_8_,
                                            (ulong)((long)&(ignored._M_t._M_impl.
                                                            super__Rb_tree_header._M_header.
                                                           _M_parent)->_M_color + 1));
                          }
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 6;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)
                               CONCAT17(ignored._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent._7_1_,0x326563726f66);
                          ignored._M_t._M_impl._0_8_ = pp_Var1;
                          ArgsManager::ForceSetArg
                                    (&parser.super_ArgsManager,&key,(string *)&ignored);
                          if ((_Base_ptr *)ignored._M_t._M_impl._0_8_ != pp_Var1) {
                            operator_delete((void *)ignored._M_t._M_impl._0_8_,
                                            (ulong)((long)&(ignored._M_t._M_impl.
                                                            super__Rb_tree_header._M_header.
                                                           _M_parent)->_M_color + 1));
                          }
                        }
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&desc," || ");
                        bVar6 = ArgsManager::IsArgSet(&parser.super_ArgsManager,&key);
                        if (bVar6) {
                          bVar6 = ArgsManager::IsArgNegated(&parser.super_ArgsManager,&key);
                          if (bVar6) {
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            append(&desc,"negated");
                            local_820 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                            ;
                            local_818 = "";
                            local_840._M_left =
                                 (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
                            local_840._M_right =
                                 (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
                            file_03.m_end = (iterator)0x36e;
                            file_03.m_begin = (iterator)&local_820;
                            msg_03.m_end = pvVar26;
                            msg_03.m_begin = pvVar23;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_03,(size_t)&local_840._M_left,msg_03);
                            local_810._M_parent =
                                 (_Base_ptr)((ulong)local_810._M_parent & 0xffffffffffffff00);
                            local_810._0_8_ = &PTR__lazy_ostream_013abb30;
                            local_810._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                            local_810._M_right = (_Base_ptr)0xf6cf21;
                            local_520._0_8_ = local_520 + 0x10;
                            local_520._16_4_ = 0x61666564;
                            local_520._8_8_ = (_Base_ptr)0x7;
                            local_520._20_4_ = 0x746c75;
                            ArgsManager::GetArg(&local_500,&parser.super_ArgsManager,&key,
                                                (string *)local_520);
                            iVar7 = std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::compare(&local_500,"0");
                            local_710._M_color._0_1_ = iVar7 == 0;
                            local_710._M_parent = (_Base_ptr)0x0;
                            local_710._M_left = (_Base_ptr)0x0;
                            local_720 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                            ;
                            local_718 = "";
                            ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                                 0xffffffffffffff00;
                            ignored._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abbf0;
                            ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                            ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 &local_840;
                            local_850 = "0";
                            local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                            local_58._0_8_ = &PTR__lazy_ostream_013ac2b0;
                            aStack_48._M_allocated_capacity =
                                 (size_type)boost::unit_test::lazy_ostream::inst;
                            aStack_48._8_8_ = &local_850;
                            pvVar23 = (iterator)0x1;
                            pvVar26 = (iterator)0x2;
                            local_840._0_8_ = &local_500;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&local_710,(lazy_ostream *)&local_810,1,2
                                       ,REQUIRE,0xe58793,(size_t)&local_720,0x36e,&ignored,"\"0\"",
                                       local_58);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)&local_710._M_left);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_500._M_dataplus._M_p != &local_500.field_2) {
                              operator_delete(local_500._M_dataplus._M_p,
                                              local_500.field_2._M_allocated_capacity + 1);
                            }
                            if ((_Alloc_hider *)local_520._0_8_ !=
                                (_Alloc_hider *)(local_520 + 0x10)) {
                              operator_delete((void *)local_520._0_8_,
                                              CONCAT44(local_520._20_4_,local_520._16_4_) + 1);
                            }
                            local_500._M_dataplus._M_p =
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                            ;
                            local_500._M_string_length = 0xe561df;
                            local_520._0_8_ = &boost::unit_test::basic_cstring<char_const>::null;
                            local_520._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
                            file_04.m_end = (iterator)0x36f;
                            file_04.m_begin = (iterator)&local_500;
                            msg_04.m_end = pvVar26;
                            msg_04.m_begin = pvVar23;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_04,(size_t)local_520,msg_04);
                            _cVar32 = 0x2881d7;
                            ArgsManager::GetArgs
                                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&local_810,&parser.super_ArgsManager,&key);
                            local_58[0] = (_Base_ptr)local_810._0_8_ == local_810._M_parent;
                            local_58._8_8_ = (element_type *)0x0;
                            aStack_48._M_allocated_capacity = 0;
                            local_710._0_8_ = "parser.GetArgs(key).empty()";
                            local_710._M_parent = (_Base_ptr)0xe587cc;
                            ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                                 0xffffffffffffff00;
                            ignored._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abc70;
                            ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                            ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 &local_710;
                            local_720 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                            ;
                            local_718 = "";
                            pvVar23 = (iterator)0x1;
                            pvVar26 = (iterator)0x0;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)local_58,(lazy_ostream *)&ignored,1,0,
                                       WARN,_cVar32,(size_t)&local_720,0x36f);
                            goto LAB_0028876b;
                          }
                          local_58._0_8_ = &aStack_48;
                          aStack_48._M_allocated_capacity = 0x746c7561666564;
                          local_58._8_8_ = (element_type *)0x7;
                          ArgsManager::GetArg((string *)&ignored,&parser.super_ArgsManager,&key,
                                              (string *)local_58);
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_append(&desc,(char *)ignored._M_t._M_impl._0_8_,
                                    ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
                          if ((_Base_ptr *)ignored._M_t._M_impl._0_8_ !=
                              &ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                            operator_delete((void *)ignored._M_t._M_impl._0_8_,
                                            (ulong)((long)&(ignored._M_t._M_impl.
                                                            super__Rb_tree_header._M_header.
                                                           _M_parent)->_M_color + 1));
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_58._0_8_ != &aStack_48) {
                            operator_delete((void *)local_58._0_8_,
                                            (ulong)(aStack_48._M_allocated_capacity + 1));
                          }
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&desc," |");
                          ArgsManager::GetArgs
                                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&ignored,&parser.super_ArgsManager,&key);
                          uVar5 = ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                          pbVar31 = __str;
                          for (puVar28 = (undefined8 *)ignored._M_t._M_impl._0_8_;
                              puVar28 != (undefined8 *)uVar5; puVar28 = puVar28 + 4) {
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            append(&desc," ");
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            _M_append(&desc,(char *)*puVar28,puVar28[1]);
                          }
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&ignored);
                        }
                        else {
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&desc,"unset");
                          local_820 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                          ;
                          local_818 = "";
                          local_840._M_left =
                               (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
                          local_840._M_right =
                               (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
                          file_05.m_end = (iterator)0x369;
                          file_05.m_begin = (iterator)&local_820;
                          msg_05.m_end = pvVar26;
                          msg_05.m_begin = pvVar23;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                                     (size_t)&local_840._M_left,msg_05);
                          _cVar32 = 0x28831e;
                          bVar6 = ArgsManager::IsArgNegated(&parser.super_ArgsManager,&key);
                          local_58[0] = !bVar6;
                          local_58._8_8_ = (element_type *)0x0;
                          aStack_48._M_allocated_capacity = 0;
                          local_810._0_8_ = "!parser.IsArgNegated(key)";
                          local_810._M_parent = (_Base_ptr)0xe58792;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                               ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                               0xffffffffffffff00;
                          ignored._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abc70;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &local_810;
                          local_840._0_8_ =
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                          ;
                          local_840._M_parent = (_Base_ptr)0xe561df;
                          pvVar23 = (iterator)0x1;
                          pvVar26 = (iterator)0x0;
                          boost::test_tools::tt_detail::report_assertion
                                    ((assertion_result *)local_58,(lazy_ostream *)&ignored,1,0,WARN,
                                     _cVar32,(size_t)&local_840,0x369);
                          boost::detail::shared_count::~shared_count
                                    ((shared_count *)&aStack_48._M_allocated_capacity);
                          local_850 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                          ;
                          local_848 = "";
                          local_870._M_left =
                               (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
                          local_870._M_right =
                               (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
                          file_06.m_end = (iterator)0x36a;
                          file_06.m_begin = (iterator)&local_850;
                          msg_06.m_end = pvVar26;
                          msg_06.m_begin = pvVar23;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                                     (size_t)&local_870._M_left,msg_06);
                          local_810._M_parent =
                               (_Base_ptr)((ulong)local_810._M_parent & 0xffffffffffffff00);
                          local_810._0_8_ = &PTR__lazy_ostream_013abb30;
                          local_810._M_left = (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                          local_810._M_right = (_Base_ptr)0xf6cf21;
                          local_520._0_8_ = local_520 + 0x10;
                          local_520._16_4_ = 0x61666564;
                          local_520._8_8_ = (_Base_ptr)0x7;
                          local_520._20_4_ = 0x746c75;
                          ArgsManager::GetArg(&local_500,&parser.super_ArgsManager,&key,
                                              (string *)local_520);
                          iVar7 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::compare(&local_500,"default");
                          local_710._M_color._0_1_ = iVar7 == 0;
                          local_710._M_parent = (_Base_ptr)0x0;
                          local_710._M_left = (_Base_ptr)0x0;
                          local_720 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                          ;
                          local_718 = "";
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                               ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                               0xffffffffffffff00;
                          ignored._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abbf0;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &local_870;
                          local_880 = "default";
                          local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                          local_58._0_8_ = &PTR__lazy_ostream_013ac3b0;
                          aStack_48._M_allocated_capacity =
                               (size_type)boost::unit_test::lazy_ostream::inst;
                          aStack_48._8_8_ = &local_880;
                          pvVar23 = (iterator)0x1;
                          pvVar26 = (iterator)0x2;
                          local_870._0_8_ = &local_500;
                          boost::test_tools::tt_detail::report_assertion
                                    ((assertion_result *)&local_710,(lazy_ostream *)&local_810,1,2,
                                     REQUIRE,0xe58793,(size_t)&local_720,0x36a,&ignored,
                                     "\"default\"",local_58);
                          boost::detail::shared_count::~shared_count
                                    ((shared_count *)&local_710._M_left);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_500._M_dataplus._M_p != &local_500.field_2) {
                            operator_delete(local_500._M_dataplus._M_p,
                                            local_500.field_2._M_allocated_capacity + 1);
                          }
                          if ((_Alloc_hider *)local_520._0_8_ != (_Alloc_hider *)(local_520 + 0x10))
                          {
                            operator_delete((void *)local_520._0_8_,
                                            CONCAT44(local_520._20_4_,local_520._16_4_) + 1);
                          }
                          local_500._M_dataplus._M_p =
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                          ;
                          local_500._M_string_length = 0xe561df;
                          local_520._0_8_ = &boost::unit_test::basic_cstring<char_const>::null;
                          local_520._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
                          file_07.m_end = (iterator)0x36b;
                          file_07.m_begin = (iterator)&local_500;
                          msg_07.m_end = pvVar26;
                          msg_07.m_begin = pvVar23;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                                     (size_t)local_520,msg_07);
                          _cVar32 = 0x28869c;
                          ArgsManager::GetArgs
                                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_810,&parser.super_ArgsManager,&key);
                          local_58[0] = (_Base_ptr)local_810._0_8_ == local_810._M_parent;
                          local_58._8_8_ = (element_type *)0x0;
                          aStack_48._M_allocated_capacity = 0;
                          local_710._0_8_ = "parser.GetArgs(key).empty()";
                          local_710._M_parent = (_Base_ptr)0xe587cc;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                               ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                               0xffffffffffffff00;
                          ignored._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abc70;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &local_710;
                          local_720 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                          ;
                          local_718 = "";
                          pvVar23 = (iterator)0x1;
                          pvVar26 = (iterator)0x0;
                          boost::test_tools::tt_detail::report_assertion
                                    ((assertion_result *)local_58,(lazy_ostream *)&ignored,1,0,WARN,
                                     _cVar32,(size_t)&local_720,0x36b);
LAB_0028876b:
                          boost::detail::shared_count::~shared_count
                                    ((shared_count *)&aStack_48._M_allocated_capacity);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&local_810);
                          pbVar31 = __str;
                        }
                        ArgsManager::GetUnsuitableSectionOnlyArgs_abi_cxx11_
                                  (&ignored,&parser.super_ArgsManager);
                        if (ignored._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&desc," | ignored");
                          for (p_Var11 = ignored._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_left;
                              (_Rb_tree_header *)p_Var11 !=
                              &ignored._M_t._M_impl.super__Rb_tree_header;
                              p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            append(&desc," ");
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            _M_append(&desc,*(char **)(p_Var11 + 1),(size_type)p_Var11[1]._M_parent)
                            ;
                          }
                        }
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&desc,"\n");
                        CSHA256::Write(&out_sha.sha,(uchar *)desc._M_dataplus._M_p,
                                       desc._M_string_length);
                        if (__s != (FILE *)0x0) {
                          local_710._0_8_ =
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                          ;
                          local_710._M_parent = (_Base_ptr)0xe561df;
                          local_870._0_8_ = &boost::unit_test::basic_cstring<char_const>::null;
                          local_870._M_parent =
                               (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
                          file_08.m_end = (iterator)0x386;
                          file_08.m_begin = (iterator)&local_710;
                          msg_08.m_end = pvVar26;
                          msg_08.m_begin = pvVar23;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                                     (size_t)&local_870,msg_08);
                          _cVar32 = 0x2889e5;
                          sVar12 = fwrite(desc._M_dataplus._M_p,1,desc._M_string_length,__s);
                          local_810._M_color._0_1_ = sVar12 == desc._M_string_length;
                          local_810._M_parent = (_Base_ptr)0x0;
                          local_810._M_left = (_Base_ptr)0x0;
                          local_880 = "fwrite(desc.data(), 1, desc.size(), out_file) == desc.size()"
                          ;
                          local_878 = "";
                          local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
                          local_58._0_8_ = &PTR__lazy_ostream_013abc70;
                          aStack_48._M_allocated_capacity =
                               (size_type)boost::unit_test::lazy_ostream::inst;
                          aStack_48._8_8_ = &local_880;
                          local_890 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                          ;
                          local_888 = "";
                          boost::test_tools::tt_detail::report_assertion
                                    ((assertion_result *)&local_810,(lazy_ostream *)local_58,2,0,
                                     WARN,_cVar32,(size_t)&local_890,0x386);
                          boost::detail::shared_count::~shared_count
                                    ((shared_count *)&local_810._M_left);
                        }
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~_Rb_tree(&ignored._M_t);
                        std::__cxx11::istringstream::~istringstream((istringstream *)&conf_stream);
                        std::ios_base::~ios_base(local_468);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)conf._M_dataplus._M_p != &conf.field_2) {
                          operator_delete(conf._M_dataplus._M_p,
                                          conf.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)error._M_dataplus._M_p != &error.field_2) {
                          operator_delete(error._M_dataplus._M_p,
                                          CONCAT71(error.field_2._M_allocated_capacity._1_7_,
                                                   error.field_2._M_local_buf[0]) + 1);
                        }
                        if (argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(argv.
                                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)argv.
                                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)argv.
                                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector(&args);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)key._M_dataplus._M_p != &key.field_2) {
                          operator_delete(key._M_dataplus._M_p,key.field_2._M_allocated_capacity + 1
                                         );
                        }
                        if ((string *)local_2e0._0_8_ != (string *)(local_2e0 + 0x10)) {
                          operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)desc._M_dataplus._M_p != &desc.field_2) {
                          operator_delete(desc._M_dataplus._M_p,
                                          CONCAT44(desc.field_2._M_allocated_capacity._4_4_,
                                                   desc.field_2._M_allocated_capacity._0_4_) + 1);
                        }
                        std::unique_lock<std::recursive_mutex>::~unique_lock
                                  (&criticalblock21.super_unique_lock);
                        ArgsManager::~ArgsManager(&parser.super_ArgsManager);
                        lVar13 = lVar13 + 1;
                      } while (lVar13 != 2);
                      lVar14 = lVar14 + 0x20;
                    } while (lVar14 != 0x80);
                    lVar14 = -0x80;
                    paVar19 = &local_5f8.field_2;
                    do {
                      if (paVar19 !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(&paVar19->_M_allocated_capacity)[-2]) {
                        operator_delete((long *)(&paVar19->_M_allocated_capacity)[-2],
                                        paVar19->_M_allocated_capacity + 1);
                      }
                      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(&paVar19->_M_allocated_capacity + -4);
                      lVar14 = lVar14 + 0x20;
                    } while (lVar14 != 0);
                    lVar27 = lVar27 + 0x20;
                  } while (lVar27 != 0x80);
                  lVar27 = -0x80;
                  paVar19 = &local_578.field_2;
                  do {
                    if (paVar19 !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar19->_M_allocated_capacity)[-2]) {
                      operator_delete((long *)(&paVar19->_M_allocated_capacity)[-2],
                                      paVar19->_M_allocated_capacity + 1);
                    }
                    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(&paVar19->_M_allocated_capacity + -4);
                    lVar27 = lVar27 + 0x20;
                  } while (lVar27 != 0);
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 2);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 2);
            }
            AVar4 = local_668[0];
            AVar16 = local_668[0] + SET;
            if (2 < local_668[0] - SET) {
              AVar16 = SET;
            }
            lVar17 = 0;
            local_668[0] = AVar16;
            iVar7 = -1;
            bVar6 = false;
          } while (AVar4 != SECTION_NEGATE);
          lVar17 = 4;
          do {
            if (lVar17 == 0xc) goto LAB_00287136;
            iVar7 = *(int *)((long)local_668 + lVar17);
            iVar20 = iVar7 + 1;
            if (2 < iVar7 - 1U) {
              iVar20 = 1;
            }
            *(int *)((long)local_668 + lVar17) = iVar20;
            lVar17 = lVar17 + 4;
          } while (iVar7 == 4);
        } while( true );
      }
LAB_00287136:
      puVar24 = out_sha_bytes;
      pvVar23 = (iterator)0x1;
      AVar16 = local_678[0];
      lVar17 = 0;
      local_678[0] = (local_678[0] == SET) + SET;
      iVar7 = -1;
      bVar6 = false;
    } while (AVar16 != NEGATE);
    lVar17 = 4;
    do {
      if (lVar17 == 0xc) {
        if ((__s == (FILE *)0x0) || (iVar7 = fclose(__s), iVar7 == 0)) {
          output.m_size = 0x20;
          output.m_data = out_sha_bytes;
          CHash256::Finalize(&out_sha,output);
          s.m_size = 0x20;
          s.m_data = out_sha_bytes;
          HexStr_abi_cxx11_(&out_sha_hex,s);
          local_8a0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
          ;
          local_898 = "";
          local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_09.m_end = (iterator)0x39c;
          file_09.m_begin = (iterator)&local_8a0;
          msg_09.m_end = pvVar23;
          msg_09.m_begin = (iterator)puVar24;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
                     (size_t)&local_8b0,msg_09);
          ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
          ignored._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abb30;
          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf6cf21;
          iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&out_sha_hex,
                          "f1ee5ab094cc43d16a6086fa7f2c10389e0f99902616b31bbf29189972ad1473");
          local_58[0] = iVar7 == 0;
          local_58._8_8_ = (element_type *)0x0;
          aStack_48._M_allocated_capacity = 0;
          desc._M_dataplus._M_p =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
          ;
          desc._M_string_length =
               (long)
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
               + 0x66;
          parser.super_ArgsManager.cs_args.super_recursive_mutex.super___recursive_mutex_base.
          _M_mutex.__size[8] = '\0';
          parser.super_ArgsManager.cs_args.super_recursive_mutex.super___recursive_mutex_base.
          _M_mutex.__align = (long)&PTR__lazy_ostream_013abbf0;
          parser.super_ArgsManager.cs_args.super_recursive_mutex.super___recursive_mutex_base.
          _M_mutex._16_8_ = boost::unit_test::lazy_ostream::inst;
          parser.super_ArgsManager.cs_args.super_recursive_mutex.super___recursive_mutex_base.
          _M_mutex.__data.__list.__prev = (__pthread_internal_list *)local_2e0;
          key._M_dataplus._M_p = "f1ee5ab094cc43d16a6086fa7f2c10389e0f99902616b31bbf29189972ad1473";
          _conf_stream = &PTR__lazy_ostream_013ac4f0;
          local_4d0[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
          local_4d0[0]._8_8_ = &key;
          local_2e0._0_8_ = &out_sha_hex;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_58,(lazy_ostream *)&ignored,1,2,REQUIRE,0xe5829d,
                     (size_t)&desc,0x39c,&parser,
                     "\"f1ee5ab094cc43d16a6086fa7f2c10389e0f99902616b31bbf29189972ad1473\"",
                     &conf_stream);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&aStack_48._M_allocated_capacity);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out_sha_hex._M_dataplus._M_p != &out_sha_hex.field_2) {
            operator_delete(out_sha_hex._M_dataplus._M_p,
                            out_sha_hex.field_2._M_allocated_capacity + 1);
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            return;
          }
        }
        else {
          this_00 = (system_error *)__cxa_allocate_exception(0x20);
          piVar9 = __errno_location();
          iVar7 = *piVar9;
          peVar10 = (error_category *)std::_V2::generic_category();
          std::system_error::system_error(this_00,iVar7,peVar10,"fclose failed");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) goto LAB_00288f79;
        }
        goto LAB_00289568;
      }
      iVar7 = *(int *)((long)local_678 + lVar17);
      *(uint *)((long)local_678 + lVar17) = (iVar7 == 1) + 1;
      lVar17 = lVar17 + 4;
    } while (iVar7 == 2);
  } while( true );
}

Assistant:

BOOST_FIXTURE_TEST_CASE(util_ArgsMerge, ArgsMergeTestingSetup)
{
    CHash256 out_sha;
    FILE* out_file = nullptr;
    if (const char* out_path = getenv("ARGS_MERGE_TEST_OUT")) {
        out_file = fsbridge::fopen(out_path, "w");
        if (!out_file) throw std::system_error(errno, std::generic_category(), "fopen failed");
    }

    ForEachMergeSetup([&](const ActionList& arg_actions, const ActionList& conf_actions, bool soft_set, bool force_set,
                          const std::string& section, const std::string& network, bool net_specific) {
        TestArgsManager parser;
        LOCK(parser.cs_args);

        std::string desc = "net=";
        desc += network;
        parser.m_network = network;

        const std::string& name = net_specific ? "wallet" : "server";
        const std::string key = "-" + name;
        parser.AddArg(key, name, ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
        if (net_specific) parser.SetNetworkOnlyArg(key);

        auto args = GetValues(arg_actions, section, name, "a");
        std::vector<const char*> argv = {"ignored"};
        for (auto& arg : args) {
            arg.insert(0, "-");
            desc += " ";
            desc += arg;
            argv.push_back(arg.c_str());
        }
        std::string error;
        BOOST_CHECK(parser.ParseParameters(argv.size(), argv.data(), error));
        BOOST_CHECK_EQUAL(error, "");

        std::string conf;
        for (auto& conf_val : GetValues(conf_actions, section, name, "c")) {
            desc += " ";
            desc += conf_val;
            conf += conf_val;
            conf += "\n";
        }
        std::istringstream conf_stream(conf);
        BOOST_CHECK(parser.ReadConfigStream(conf_stream, "filepath", error));
        BOOST_CHECK_EQUAL(error, "");

        if (soft_set) {
            desc += " soft";
            parser.SoftSetArg(key, "soft1");
            parser.SoftSetArg(key, "soft2");
        }

        if (force_set) {
            desc += " force";
            parser.ForceSetArg(key, "force1");
            parser.ForceSetArg(key, "force2");
        }

        desc += " || ";

        if (!parser.IsArgSet(key)) {
            desc += "unset";
            BOOST_CHECK(!parser.IsArgNegated(key));
            BOOST_CHECK_EQUAL(parser.GetArg(key, "default"), "default");
            BOOST_CHECK(parser.GetArgs(key).empty());
        } else if (parser.IsArgNegated(key)) {
            desc += "negated";
            BOOST_CHECK_EQUAL(parser.GetArg(key, "default"), "0");
            BOOST_CHECK(parser.GetArgs(key).empty());
        } else {
            desc += parser.GetArg(key, "default");
            desc += " |";
            for (const auto& arg : parser.GetArgs(key)) {
                desc += " ";
                desc += arg;
            }
        }

        std::set<std::string> ignored = parser.GetUnsuitableSectionOnlyArgs();
        if (!ignored.empty()) {
            desc += " | ignored";
            for (const auto& arg : ignored) {
                desc += " ";
                desc += arg;
            }
        }

        desc += "\n";

        out_sha.Write(MakeUCharSpan(desc));
        if (out_file) {
            BOOST_REQUIRE(fwrite(desc.data(), 1, desc.size(), out_file) == desc.size());
        }
    });

    if (out_file) {
        if (fclose(out_file)) throw std::system_error(errno, std::generic_category(), "fclose failed");
        out_file = nullptr;
    }

    unsigned char out_sha_bytes[CSHA256::OUTPUT_SIZE];
    out_sha.Finalize(out_sha_bytes);
    std::string out_sha_hex = HexStr(out_sha_bytes);

    // If check below fails, should manually dump the results with:
    //
    //   ARGS_MERGE_TEST_OUT=results.txt ./test_bitcoin --run_test=argsman_tests/util_ArgsMerge
    //
    // And verify diff against previous results to make sure the changes are expected.
    //
    // Results file is formatted like:
    //
    //   <input> || <IsArgSet/IsArgNegated/GetArg output> | <GetArgs output> | <GetUnsuitable output>
    BOOST_CHECK_EQUAL(out_sha_hex, "f1ee5ab094cc43d16a6086fa7f2c10389e0f99902616b31bbf29189972ad1473");
}